

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket.cpp
# Opt level: O1

Status __thiscall mognetwork::TcpSocket::sendPendingDatas(TcpSocket *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  void *pvVar3;
  _List_node_base *p_Var4;
  SocketFD __fd;
  Status SVar5;
  ssize_t sVar6;
  size_type __new_size;
  uint uVar7;
  vector<char,_std::allocator<char>_> local_48;
  
  while( true ) {
    p_Var2 = (this->m_pendingDatas).
             super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)&this->m_pendingDatas) {
      return Nok;
    }
    __fd = Socket::getSocketFD(&this->super_Socket);
    pvVar3 = (p_Var2[1]._M_next)->_M_next;
    sVar6 = ::send(__fd,pvVar3,(long)(p_Var2[1]._M_next)->_M_prev - (long)pvVar3,0x4000);
    uVar7 = (uint)sVar6;
    if ((int)uVar7 < 0) {
      SVar5 = OsSocket::getErrorStatus();
      return SVar5;
    }
    if (uVar7 == 0) {
      return Disconnected;
    }
    p_Var4 = p_Var2[1]._M_next;
    pvVar3 = p_Var4->_M_next;
    if ((ulong)(uVar7 & 0x7fffffff) != (long)p_Var4->_M_prev - (long)pvVar3) break;
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3);
    }
    operator_delete(p_Var4);
    p_Var2 = (this->m_pendingDatas).
             super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    psVar1 = &(this->m_pendingDatas).
              super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2);
  }
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::resize
            (&local_48,(long)(p_Var2[1]._M_next)->_M_prev - (long)(p_Var2[1]._M_next)->_M_next,'\0')
  ;
  pvVar3 = (p_Var2[1]._M_next)->_M_next;
  memcpy(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start,pvVar3,(long)(p_Var2[1]._M_next)->_M_prev - (long)pvVar3);
  p_Var4 = p_Var2[1]._M_next;
  __new_size = (long)*(pointer *)
                      &((_Vector_base<char,_std::allocator<char>_> *)&p_Var4->_M_prev)->_M_impl -
               (long)((((_Vector_base<char,_std::allocator<char>_> *)&p_Var4->_M_next)->_M_impl).
                      super__Vector_impl_data._M_start + (uVar7 & 0x7fffffff));
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)p_Var4,__new_size,'\0');
  memcpy((p_Var2[1]._M_next)->_M_next,
         local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start,__new_size);
  if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return Ok;
}

Assistant:

Socket::Status TcpSocket::sendPendingDatas()
  {
    //    m_mutex.lock();
    if (!m_pendingDatas.empty())
      {
	int sended;
	DataList::iterator it = m_pendingDatas.begin();
	sended = ::send(getSocketFD(), &(*it)->front(), (*it)->size(), flags);
	if (sended < 0) {
	  //	  m_mutex.unlock();
	  return (OsSocket::getErrorStatus());
	}
	if (sended == 0) {
	  //m_mutex.unlock();
	  return (Disconnected);
	}
	if ((std::size_t)sended == (*it)->size())
	  {
	    delete *it;
	    m_pendingDatas.pop_front();
	    //m_mutex.unlock();
	    return (sendPendingDatas());
	  }
	Data temp;
	temp.resize((*it)->size());
	std::memcpy(&temp[0], &(*it)->front(), (*it)->size());
	std::size_t waiting = (*it)->size() - sended;
	(*it)->resize(waiting);
	std::memcpy(&(*it)->front(), &temp[0], waiting);
	//	m_mutex.unlock();
	return (Ok);
      }
    //    m_mutex.unlock();
    return (Nok);
  }